

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.h
# Opt level: O2

bool __thiscall
google::protobuf::compiler::cpp::FileGenerator::IsDepWeak(FileGenerator *this,FileDescriptor *dep)

{
  size_type sVar1;
  LogMessage *other;
  LogFinisher local_51;
  FileDescriptor *dep_local;
  LogMessage local_48;
  
  dep_local = dep;
  sVar1 = std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::count(&this->weak_deps_,&dep_local);
  if ((sVar1 != 0) && ((this->options_).opensource_runtime == true)) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.h"
               ,0xb2);
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: !options_.opensource_runtime: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return sVar1 != 0;
}

Assistant:

bool IsDepWeak(const FileDescriptor* dep) const {
    if (weak_deps_.count(dep) != 0) {
      GOOGLE_CHECK(!options_.opensource_runtime);
      return true;
    }
    return false;
  }